

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_destroy(nn_epbase *self)

{
  nn_fsm *local_20;
  nn_cinproc *cinproc;
  nn_epbase *self_local;
  
  if (self == (nn_epbase *)0x0) {
    local_20 = (nn_fsm *)0x0;
  }
  else {
    local_20 = (nn_fsm *)(self + -6);
  }
  nn_sinproc_term((nn_sinproc *)&local_20[1].stopped);
  nn_fsm_term(local_20);
  nn_ins_item_term((nn_ins_item *)&local_20[1].shutdown_fn);
  nn_free(local_20);
  return;
}

Assistant:

static void nn_cinproc_destroy (struct nn_epbase *self)
{
    struct nn_cinproc *cinproc;

    cinproc = nn_cont (self, struct nn_cinproc, item.epbase);

    nn_sinproc_term (&cinproc->sinproc);
    nn_fsm_term (&cinproc->fsm);
    nn_ins_item_term (&cinproc->item);

    nn_free (cinproc);
}